

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

void pztopology::TPZPrism::ComputeDirections
               (int side,TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *sidevectors)

{
  TPZFMatrix<double> bvec;
  TPZFMatrix<double> t2vec;
  TPZFMatrix<double> t1vec;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "static void pztopology::TPZPrism::ComputeDirections(int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, TPZVec<int> &)"
             ,0x6f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Deprecated method, not compatible with Piola transform\n",0x37);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzprism.cpp"
             ,0x5e1);
}

Assistant:

void TPZPrism::ComputeDirections(int side, TPZFMatrix<REAL> &gradx, TPZFMatrix<REAL> &directions, TPZVec<int> &sidevectors)
    {
        // this method is out of date
        std::cout << __PRETTY_FUNCTION__ << "Deprecated method, not compatible with Piola transform\n";
        DebugStop();

        if(gradx.Cols()!=3)
        { std::cout << "Gradient dimensions are not compatible with this topology" << std::endl;
            DebugStop();
        }
        TPZFMatrix<REAL> bvec(3,63);
        int numvec = bvec.Cols();
        TPZFMatrix<REAL> t1vec(3,numvec);
        TPZFMatrix<REAL> t2vec(3,numvec);
        
        directions.Redim(3, numvec);
        for (int lin = 0; lin<numvec; lin++)
        {
            for(int col = 0;col<3;col++)
            {
                bvec.PutVal(col, lin, bPrism[lin][col]);
                t1vec.PutVal(col, lin, t1Prism[lin][col]);
                t2vec.PutVal(col, lin, t2Prism[lin][col]);
            }
        }
        
        // calcula os vetores
        switch (side) {
            case 15:
            {
                directions.Resize(3, 7);
                sidevectors.Resize(7);
                int inicio = 0, fim = 6;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 16:
            {
                directions.Resize(3, 9);
                sidevectors.Resize(9);
                int inicio = 7, fim = 15;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 17:
            {
                directions.Resize(3, 9);
                sidevectors.Resize(9);
                int inicio = 16, fim = 24;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 18:
            {
                directions.Resize(3, 9);
                sidevectors.Resize(9);
                int inicio = 25, fim = 33;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 19:
            {
                directions.Resize(3, 7);
                sidevectors.Resize(7);
                int inicio = 34, fim = 40;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 20:
            {
                directions.Resize(3, 22);
                sidevectors.Resize(22);
                int inicio = 41, fim = 62;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
                
            default:
                break;
        }

                
	}